

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O3

bool __thiscall MT32Emu::Poly::startDecay(Poly *this)

{
  PolyState PVar1;
  PolyState PVar2;
  int t;
  long lVar3;
  
  PVar1 = this->state;
  PVar2 = PVar1 & ~POLY_Held;
  if (PVar2 != POLY_Releasing) {
    this->state = POLY_Releasing;
    (*this->part->_vptr_Part[10])(this->part,(ulong)PVar1,2);
    lVar3 = 0;
    do {
      if (this->partials[lVar3] != (Partial *)0x0) {
        Partial::startDecayAll(this->partials[lVar3]);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  return PVar2 != POLY_Releasing;
}

Assistant:

bool Poly::startDecay() {
	if (state == POLY_Inactive || state == POLY_Releasing) {
		return false;
	}
	setState(POLY_Releasing);

	for (int t = 0; t < 4; t++) {
		Partial *partial = partials[t];
		if (partial != NULL) {
			partial->startDecayAll();
		}
	}
	return true;
}